

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

BOOL list_overlap(List *l1,List *l2)

{
  BOOL BVar1;
  bool local_21;
  List *l2_local;
  List *l1_local;
  
  if ((l1 == (List *)0x0) || (l2 == (List *)0x0)) {
    l1_local._4_4_ = FALSE;
  }
  else if (l1 == l2) {
    l1_local._4_4_ = TRUE;
  }
  else {
    BVar1 = list_overlap(l1,l2->car);
    local_21 = true;
    if (BVar1 == FALSE) {
      BVar1 = list_overlap(l1,l2->cdr);
      local_21 = true;
      if (BVar1 == FALSE) {
        BVar1 = list_overlap(l1->car,l2);
        local_21 = true;
        if (BVar1 == FALSE) {
          BVar1 = list_overlap(l1->cdr,l2);
          local_21 = BVar1 != FALSE;
        }
      }
    }
    l1_local._4_4_ = (BOOL)local_21;
  }
  return l1_local._4_4_;
}

Assistant:

BOOL
list_overlap (const List *l1, const List *l2)
{
  if (l1 == NULL || l2 == NULL)
    return FALSE;
  if (l1 == l2)
    return TRUE;
  return (list_overlap (l1, l2->car)
	  || list_overlap (l1, l2->cdr)
	  || list_overlap (l1->car, l2)
	  || list_overlap (l1->cdr, l2));
}